

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touch_input.c
# Opt level: O1

_Bool al_install_touch_input(void)

{
  _Bool _Var1;
  ALLEGRO_SYSTEM *pAVar2;
  
  _Var1 = true;
  if (touch_input_driver == (ALLEGRO_TOUCH_INPUT_DRIVER *)0x0) {
    pAVar2 = al_get_system_driver();
    if (pAVar2->vt->get_touch_input_driver != (_func_ALLEGRO_TOUCH_INPUT_DRIVER_ptr *)0x0) {
      pAVar2 = al_get_system_driver();
      touch_input_driver = (*pAVar2->vt->get_touch_input_driver)();
      if (touch_input_driver != (ALLEGRO_TOUCH_INPUT_DRIVER *)0x0) {
        _Var1 = (*touch_input_driver->init_touch_input)();
        if (_Var1) {
          _al_add_exit_func(al_uninstall_touch_input,"al_uninstall_touch_input");
          return true;
        }
        touch_input_driver = (ALLEGRO_TOUCH_INPUT_DRIVER *)0x0;
      }
    }
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool al_install_touch_input(void)
{
   if (touch_input_driver)
      return true;

   if (al_get_system_driver()->vt->get_touch_input_driver) {

      touch_input_driver = al_get_system_driver()->vt->get_touch_input_driver();
      if (touch_input_driver) {
         if (!touch_input_driver->init_touch_input()) {
            touch_input_driver = NULL;
            return false;
         }

         _al_add_exit_func(al_uninstall_touch_input, "al_uninstall_touch_input");
         return true;
      }
   }

   return false;
}